

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O0

void __thiscall
QtMWidgets::DateTimePicker::mouseReleaseEvent(DateTimePicker *this,QMouseEvent *event)

{
  MouseButton MVar1;
  DateTimePickerPrivate *pDVar2;
  socklen_t *in_RCX;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *extraout_RDX_01;
  sockaddr *__addr;
  int __fd;
  QMouseEvent *event_local;
  DateTimePicker *this_local;
  
  __fd = (int)event;
  MVar1 = QSinglePointEvent::button((QSinglePointEvent *)event);
  if (MVar1 == LeftButton) {
    pDVar2 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
             ::operator->(&this->d);
    __addr = extraout_RDX;
    if ((pDVar2->leftMouseButtonPressed & 1U) != 0) {
      pDVar2 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
               ::operator->(&this->d);
      __addr = extraout_RDX_00;
      if ((pDVar2->scrolling & 1U) == 0) {
        pDVar2 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
                 ::operator->(&this->d);
        DateTimePickerPrivate::releaseScrolling(pDVar2);
        __addr = extraout_RDX_01;
      }
    }
    QEvent::accept((QEvent *)event,__fd,__addr,in_RCX);
  }
  else {
    QEvent::ignore((QEvent *)event);
  }
  return;
}

Assistant:

void
DateTimePicker::mouseReleaseEvent( QMouseEvent * event )
{
	if( event->button() == Qt::LeftButton )
	{
		if( d->leftMouseButtonPressed && !d->scrolling )
			d->releaseScrolling();

		event->accept();
	}
	else
		event->ignore();
}